

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleContentModel.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::SimpleContentModel::checkUniqueParticleAttribution
          (SimpleContentModel *this,SchemaGrammar *pGrammar,GrammarResolver *pGrammarResolver,
          XMLStringPool *pStringPool,XMLValidator *pValidator,uint *pContentSpecOrgURI,
          XMLCh *pComplexTypeName)

{
  bool bVar1;
  XMLCh *text2;
  XMLCh *text3;
  undefined1 local_50 [8];
  SubstitutionGroupComparator comparator;
  uint orgURIIndex;
  uint *pContentSpecOrgURI_local;
  XMLValidator *pValidator_local;
  XMLStringPool *pStringPool_local;
  GrammarResolver *pGrammarResolver_local;
  SchemaGrammar *pGrammar_local;
  SimpleContentModel *this_local;
  
  comparator.fStringPool._4_4_ = 0;
  comparator.fStringPool._4_4_ = QName::getURI(this->fFirstChild);
  if (((comparator.fStringPool._4_4_ != 0xfffffff1) && (comparator.fStringPool._4_4_ != 0xfffffffe))
     && (comparator.fStringPool._4_4_ != 0xffffffff)) {
    QName::setURI(this->fFirstChild,pContentSpecOrgURI[comparator.fStringPool._4_4_]);
  }
  comparator.fStringPool._4_4_ = QName::getURI(this->fSecondChild);
  if (((comparator.fStringPool._4_4_ != 0xfffffff1) && (comparator.fStringPool._4_4_ != 0xfffffffe))
     && (comparator.fStringPool._4_4_ != 0xffffffff)) {
    QName::setURI(this->fSecondChild,pContentSpecOrgURI[comparator.fStringPool._4_4_]);
  }
  if ((this->fOp & (Any_NS|Any_Other)) == Choice) {
    SubstitutionGroupComparator::SubstitutionGroupComparator
              ((SubstitutionGroupComparator *)local_50,pGrammarResolver,pStringPool);
    bVar1 = XercesElementWildcard::conflict
                      (pGrammar,Leaf,this->fFirstChild,Leaf,this->fSecondChild,
                       (SubstitutionGroupComparator *)local_50);
    if (bVar1) {
      text2 = QName::getRawName(this->fFirstChild);
      text3 = QName::getRawName(this->fSecondChild);
      XMLValidator::emitError
                (pValidator,UniqueParticleAttributionFail,pComplexTypeName,text2,text3,(XMLCh *)0x0)
      ;
    }
    SubstitutionGroupComparator::~SubstitutionGroupComparator
              ((SubstitutionGroupComparator *)local_50);
  }
  return;
}

Assistant:

void SimpleContentModel::checkUniqueParticleAttribution
    (
        SchemaGrammar*    const pGrammar
      , GrammarResolver*  const pGrammarResolver
      , XMLStringPool*    const pStringPool
      , XMLValidator*     const pValidator
      , unsigned int*     const pContentSpecOrgURI
      , const XMLCh*            pComplexTypeName /*= 0*/
    )
{
    // rename back
    unsigned int orgURIIndex = 0;

    orgURIIndex = fFirstChild->getURI();
    if ((orgURIIndex != XMLContentModel::gEOCFakeId) &&
        (orgURIIndex != XMLElementDecl::fgInvalidElemId) &&
        (orgURIIndex != XMLElementDecl::fgPCDataElemId))
        fFirstChild->setURI(pContentSpecOrgURI[orgURIIndex]);

    orgURIIndex = fSecondChild->getURI();
    if ((orgURIIndex != XMLContentModel::gEOCFakeId) &&
        (orgURIIndex != XMLElementDecl::fgInvalidElemId) &&
        (orgURIIndex != XMLElementDecl::fgPCDataElemId))
        fSecondChild->setURI(pContentSpecOrgURI[orgURIIndex]);

    // only possible violation is when it's a choice
    if ((fOp & 0x0f) == ContentSpecNode::Choice) {

        SubstitutionGroupComparator comparator(pGrammarResolver, pStringPool);

        if (XercesElementWildcard::conflict(pGrammar,
                                            ContentSpecNode::Leaf,
                                            fFirstChild,
                                            ContentSpecNode::Leaf,
                                            fSecondChild,
                                            &comparator))

            pValidator->emitError(XMLValid::UniqueParticleAttributionFail,
                                  pComplexTypeName,
                                  fFirstChild->getRawName(),
                                  fSecondChild->getRawName());
    }
}